

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

int Extra_bddSuppDifferentVars(DdManager *dd,DdNode *S1,DdNode *S2,int DiffMax)

{
  int iVar1;
  bool bVar2;
  int local_30;
  int Result;
  int DiffMax_local;
  DdNode *S2_local;
  DdNode *S1_local;
  DdManager *dd_local;
  
  local_30 = 0;
  _Result = S2;
  S2_local = S1;
  while( true ) {
    bVar2 = false;
    if (S2_local->index != 0x7fffffff) {
      bVar2 = _Result->index != 0x7fffffff;
    }
    if (!bVar2) break;
    if (S2_local->index == _Result->index) {
      S2_local = (S2_local->type).kids.T;
      _Result = (_Result->type).kids.T;
    }
    else {
      local_30 = local_30 + 1;
      if (DiffMax <= local_30) {
        return DiffMax;
      }
      if (dd->perm[S2_local->index] < dd->perm[_Result->index]) {
        S2_local = (S2_local->type).kids.T;
      }
      else {
        _Result = (_Result->type).kids.T;
      }
    }
  }
  if (S2_local->index == 0x7fffffff) {
    if (_Result->index != 0x7fffffff) {
      iVar1 = Extra_bddSuppSize(dd,_Result);
      local_30 = iVar1 + local_30;
    }
  }
  else {
    iVar1 = Extra_bddSuppSize(dd,S2_local);
    local_30 = iVar1 + local_30;
  }
  dd_local._4_4_ = DiffMax;
  if (local_30 < DiffMax) {
    dd_local._4_4_ = local_30;
  }
  return dd_local._4_4_;
}

Assistant:

int Extra_bddSuppDifferentVars( DdManager * dd, DdNode * S1, DdNode * S2, int DiffMax )
{
    int Result = 0;
    while ( S1->index != CUDD_CONST_INDEX && S2->index != CUDD_CONST_INDEX )
    {
        // if the top vars are the same, this var is the same
        if ( S1->index == S2->index )
        {
            S1 = cuddT(S1);
            S2 = cuddT(S2);
            continue;
        }
        // the top var is different
        Result++;

        if ( Result >= DiffMax )
            return DiffMax;

        // if the top vars are different, skip the one, which is higher
        if ( dd->perm[S1->index] < dd->perm[S2->index] )
            S1 = cuddT(S1);
        else
            S2 = cuddT(S2);
    }

    // consider the remaining variables
    if ( S1->index != CUDD_CONST_INDEX )
        Result += Extra_bddSuppSize(dd,S1);
    else if ( S2->index != CUDD_CONST_INDEX )
        Result += Extra_bddSuppSize(dd,S2);

    if ( Result >= DiffMax )
        return DiffMax;
    return Result;
}